

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

void __thiscall
Hospital::Update_Nurses_Time_Table_File
          (Hospital *this,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *Nurses_Timetable,ofstream *inFile)

{
  ostream *poVar1;
  int i;
  long lVar2;
  long lVar3;
  ofstream abus;
  
  system("pause");
  std::ofstream::ofstream(&abus);
  std::ofstream::open((char *)&abus,0x11c177);
  for (lVar2 = 0; lVar2 != 7; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 0xc0; lVar3 = lVar3 + 0x20) {
      poVar1 = std::operator<<((ostream *)&abus,
                               (string *)
                               (*(long *)&(Nurses_Timetable->
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start[lVar2].
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data + lVar3));
      std::operator<<(poVar1," ");
    }
    std::operator<<((ostream *)&abus,"\n");
  }
  std::ofstream::~ofstream(&abus);
  return;
}

Assistant:

void Hospital::  Update_Nurses_Time_Table_File (vector<vector<string>>& Nurses_Timetable , ofstream& inFile){
    system("pause");
    //  cout << "hiiiii";
    ofstream abus;
    abus.open("Nurses_Timetable.txt");
    //abus <<"Asghar";

    for (int i = 0; i < 7; i++) {
        for (int j = 0; j < 6; ++j) {
     //       Nurses_Timetable[i][j].erase(std::remove_if(Nurses_Timetable[i][j].begin(), Nurses_Timetable[i][j].end(), ::isspace), Nurses_Timetable[i][j].end());
            abus << Nurses_Timetable[i][j] << " ";
//            abus <<"Asghar";
        }
        abus << "\n";
    }
    //inFile.close();

}